

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O0

quint32 qFloatDistance(float a,float b)

{
  float a_00;
  quint32 qVar1;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  float local_c;
  float local_8;
  quint32 local_4;
  
  if ((in_XMM0_Da != in_XMM1_Da) || (NAN(in_XMM0_Da) || NAN(in_XMM1_Da))) {
    if (in_XMM0_Da < 0.0 == in_XMM1_Da < 0.0) {
      local_c = in_XMM1_Da;
      local_8 = in_XMM0_Da;
      if (in_XMM0_Da < 0.0) {
        local_8 = -in_XMM0_Da;
        local_c = -in_XMM1_Da;
      }
      if ((local_8 != 0.0) || (NAN(local_8))) {
        if ((local_c != 0.0) || (NAN(local_c))) {
          if (local_8 <= local_c) {
            local_4 = f2i(in_stack_ffffffffffffffdc);
            qVar1 = f2i(in_stack_ffffffffffffffdc);
            local_4 = local_4 - qVar1;
          }
          else {
            local_4 = f2i(in_stack_ffffffffffffffdc);
            qVar1 = f2i(in_stack_ffffffffffffffdc);
            local_4 = local_4 - qVar1;
          }
        }
        else {
          local_4 = f2i(in_stack_ffffffffffffffdc);
        }
      }
      else {
        local_4 = f2i(in_stack_ffffffffffffffdc);
      }
    }
    else {
      a_00 = (float)qFloatDistance(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
      local_4 = qFloatDistance(a_00,in_stack_ffffffffffffffec);
      local_4 = (int)a_00 + local_4;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Q_CORE_EXPORT quint32 qFloatDistance(float a, float b)
{
    static const quint32 smallestPositiveFloatAsBits = 0x00000001;  // denormalized, (SMALLEST), (1.4E-45)
    /* Assumes:
       * IEE754 format.
       * Integers and floats have the same endian
    */
    static_assert(sizeof(quint32) == sizeof(float));
    Q_ASSERT(qIsFinite(a) && qIsFinite(b));
    if (a == b)
        return 0;
    if ((a < 0) != (b < 0)) {
        // if they have different signs
        if (a < 0)
            a = -a;
        else /*if (b < 0)*/
            b = -b;
        return qFloatDistance(0.0F, a) + qFloatDistance(0.0F, b);
    }
    if (a < 0) {
        a = -a;
        b = -b;
    }
    // at this point a and b should not be negative

    // 0 is special
    if (!a)
        return f2i(b) - smallestPositiveFloatAsBits + 1;
    if (!b)
        return f2i(a) - smallestPositiveFloatAsBits + 1;

    // finally do the common integer subtraction
    return a > b ? f2i(a) - f2i(b) : f2i(b) - f2i(a);
}